

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetDirectoryPropertyCommand::InitialPass
          (cmGetDirectoryPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *variable;
  bool bVar1;
  PolicyStatus PVar2;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar3;
  string *psVar4;
  char *prop;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_69;
  string sd;
  string local_48;
  
  variable = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)variable) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sd,"called with incorrect number of arguments",
               (allocator<char> *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&sd);
LAB_00261283:
    std::__cxx11::string::~string((string *)&sd);
    return false;
  }
  __lhs = variable + 1;
  pcVar3 = (this->super_cmCommand).Makefile;
  bVar1 = std::operator==(__lhs,"DIRECTORY");
  if (bVar1) {
    __lhs = variable + 2;
    if (__lhs == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sd,"DIRECTORY argument provided without subsequent arguments",
                 (allocator<char> *)&local_48);
      cmCommand::SetError(&this->super_cmCommand,&sd);
      goto LAB_00261283;
    }
    std::__cxx11::string::string((string *)&sd,(string *)__lhs);
    bVar1 = cmsys::SystemTools::FileIsFullPath(&sd);
    if (!bVar1) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&sd);
      std::__cxx11::string::append((char *)&sd);
      std::__cxx11::string::append((string *)&sd);
    }
    cmsys::SystemTools::CollapseFullPath(&local_48,&sd);
    std::__cxx11::string::operator=((string *)&sd,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar3 = cmGlobalGenerator::FindMakefile(this_00,&sd);
    if (pcVar3 == (cmMakefile *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_69);
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      __lhs = variable + 3;
    }
    std::__cxx11::string::~string((string *)&sd);
    if (pcVar3 == (cmMakefile *)0x0) {
      return false;
    }
  }
  bVar1 = std::operator==(__lhs,"DEFINITION");
  if (bVar1) {
    if (__lhs + 1 !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      psVar4 = cmMakefile::GetSafeDefinition(pcVar3,__lhs + 1);
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,variable,(psVar4->_M_dataplus)._M_p);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sd,
               "A request for a variable definition was made without providing the name of the variable to get."
               ,(allocator<char> *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&sd);
    goto LAB_00261283;
  }
  if (__lhs->_M_string_length == 0) {
    prop = (char *)0x0;
    goto LAB_002614bf;
  }
  bVar1 = std::operator==(__lhs,"DEFINITIONS");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0059,false);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_0026147f;
      pcVar3 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sd,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&sd);
      std::__cxx11::string::~string((string *)&sd);
    }
    prop = cmMakefile::GetDefineFlagsCMP0059((this->super_cmCommand).Makefile);
  }
  else {
LAB_0026147f:
    prop = cmMakefile::GetProperty(pcVar3,__lhs);
  }
LAB_002614bf:
  StoreResult(this,variable,prop);
  return true;
}

Assistant:

bool cmGetDirectoryPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string const& variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile* dir = this->Makefile;
  if (*i == "DIRECTORY") {
    ++i;
    if (i == args.end()) {
      this->SetError(
        "DIRECTORY argument provided without subsequent arguments");
      return false;
    }
    std::string sd = *i;
    // make sure the start dir is a full path
    if (!cmSystemTools::FileIsFullPath(sd)) {
      sd = this->Makefile->GetCurrentSourceDirectory();
      sd += "/";
      sd += *i;
    }

    // The local generators are associated with collapsed paths.
    sd = cmSystemTools::CollapseFullPath(sd);

    // lookup the makefile from the directory name
    dir = this->Makefile->GetGlobalGenerator()->FindMakefile(sd);
    if (!dir) {
      this->SetError(
        "DIRECTORY argument provided but requested directory not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
    ++i;
  }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if (*i == "DEFINITION") {
    ++i;
    if (i == args.end()) {
      this->SetError("A request for a variable definition was made without "
                     "providing the name of the variable to get.");
      return false;
    }
    std::string const& output = dir->GetSafeDefinition(*i);
    this->Makefile->AddDefinition(variable, output.c_str());
    return true;
  }

  const char* prop = nullptr;
  if (!i->empty()) {
    if (*i == "DEFINITIONS") {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0059)) {
        case cmPolicies::WARN:
          this->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          this->StoreResult(variable, this->Makefile->GetDefineFlagsCMP0059());
          return true;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
      }
    }
    prop = dir->GetProperty(*i);
  }
  this->StoreResult(variable, prop);
  return true;
}